

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# errors.cpp
# Opt level: O2

void __thiscall
camp::BadArgument::BadArgument
          (BadArgument *this,Type provided,Type expected,size_t index,string *functionName)

{
  Type type;
  Type type_00;
  _Alloc_hider in_stack_fffffffffffffe98;
  string local_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  Error::str<unsigned_long>((unsigned_long)in_stack_fffffffffffffe98._M_p);
  std::operator+(&local_128,"the argument #",&local_48);
  std::operator+(&local_108,&local_128," of function ");
  std::operator+(&local_e8,&local_108,functionName);
  std::operator+(&local_c8,&local_e8," couldn\'t be converted from type ");
  BadType::typeName_abi_cxx11_(&local_148,(BadType *)(ulong)provided,type);
  std::operator+(&local_a8,&local_c8,&local_148);
  std::operator+(&local_88,&local_a8," to type ");
  BadType::typeName_abi_cxx11_
            ((string *)&stack0xfffffffffffffe98,(BadType *)(ulong)expected,type_00);
  std::operator+(&local_68,&local_88,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &stack0xfffffffffffffe98);
  BadType::BadType(&this->super_BadType,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffe98);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_148);
  std::__cxx11::string::~string((string *)&local_c8);
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::~string((string *)&local_108);
  std::__cxx11::string::~string((string *)&local_128);
  std::__cxx11::string::~string((string *)&local_48);
  *(undefined ***)&(this->super_BadType).super_Error = &PTR__Error_00141408;
  return;
}

Assistant:

BadArgument::BadArgument(Type provided, Type expected, std::size_t index, const std::string& functionName)
    : BadType("the argument #" + str(index) + " of function " + functionName +
              " couldn't be converted from type " + typeName(provided) + " to type " + typeName(expected))
{
}